

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSpeedup.c
# Opt level: O2

Vec_Int_t * Abc_NtkPowerEstimate(Abc_Ntk_t *pNtk,int fProbOne)

{
  int *piVar1;
  Vec_Int_t *pVVar2;
  int *__s;
  Abc_Ntk_t *pNtk_00;
  Abc_Obj_t *pAVar3;
  Aig_Man_t *pAig;
  Vec_Int_t *p;
  int iVar4;
  ulong uVar5;
  int iVar6;
  int i;
  
  iVar6 = pNtk->vObjs->nSize;
  pVVar2 = (Vec_Int_t *)malloc(0x10);
  iVar4 = 0x10;
  if (0xe < iVar6 - 1U) {
    iVar4 = iVar6;
  }
  pVVar2->nCap = iVar4;
  i = 0;
  if (iVar4 == 0) {
    __s = (int *)0x0;
  }
  else {
    __s = (int *)malloc((long)iVar4 << 2);
  }
  pVVar2->pArray = __s;
  pVVar2->nSize = iVar6;
  memset(__s,0,(long)iVar6 << 2);
  pNtk_00 = Abc_NtkStrash(pNtk,0,1,0);
  for (; i < pNtk->vObjs->nSize; i = i + 1) {
    pAVar3 = Abc_NtkObj(pNtk,i);
    if ((pAVar3 != (Abc_Obj_t *)0x0) &&
       ((*(byte *)(((ulong)(pAVar3->field_6).pTemp & 0xfffffffffffffffe) + 0x14) & 0xf) == 0)) {
      (pAVar3->field_6).pTemp = (void *)0x0;
    }
  }
  pAig = Abc_NtkToDar(pNtk_00,0,(uint)(0 < pNtk->nObjCounts[8]));
  p = Saig_ManComputeSwitchProbs(pAig,0x30,0x10,fProbOne);
  piVar1 = p->pArray;
  for (iVar6 = 0; iVar6 < pNtk->vObjs->nSize; iVar6 = iVar6 + 1) {
    pAVar3 = Abc_NtkObj(pNtk,iVar6);
    if (((pAVar3 != (Abc_Obj_t *)0x0) &&
        (uVar5 = (ulong)(pAVar3->field_6).pTemp & 0xfffffffffffffffe, uVar5 != 0)) &&
       (uVar5 = *(ulong *)(uVar5 + 0x40) & 0xfffffffffffffffe, uVar5 != 0)) {
      __s[pAVar3->Id] = piVar1[*(int *)(uVar5 + 0x24)];
    }
  }
  Vec_IntFree(p);
  Aig_ManStop(pAig);
  Abc_NtkDelete(pNtk_00);
  return pVVar2;
}

Assistant:

Vec_Int_t * Abc_NtkPowerEstimate( Abc_Ntk_t * pNtk, int fProbOne )
{
    extern Aig_Man_t * Abc_NtkToDar( Abc_Ntk_t * pNtk, int fExors, int fRegisters );
    extern Vec_Int_t * Saig_ManComputeSwitchProbs( Aig_Man_t * p, int nFrames, int nPref, int fProbOne );
    Vec_Int_t * vProbs;
    Vec_Int_t * vSwitching;
    float * pProbability;
    float * pSwitching;
    Abc_Ntk_t * pNtkStr;
    Aig_Man_t * pAig;
    Aig_Obj_t * pObjAig;
    Abc_Obj_t * pObjAbc, * pObjAbc2;
    int i;
    // start the resulting array
    vProbs = Vec_IntStart( Abc_NtkObjNumMax(pNtk) );
    pProbability = (float *)vProbs->pArray;
    // strash the network
    pNtkStr = Abc_NtkStrash( pNtk, 0, 1, 0 );
    Abc_NtkForEachObj( pNtk, pObjAbc, i )
        if ( Abc_ObjRegular((Abc_Obj_t *)pObjAbc->pTemp)->Type == ABC_FUNC_NONE )
            pObjAbc->pTemp = NULL;
    // map network into an AIG
    pAig = Abc_NtkToDar( pNtkStr, 0, (int)(Abc_NtkLatchNum(pNtk) > 0) );
    vSwitching = Saig_ManComputeSwitchProbs( pAig, 48, 16, fProbOne );
    pSwitching = (float *)vSwitching->pArray;
    Abc_NtkForEachObj( pNtk, pObjAbc, i )
    {
        if ( (pObjAbc2 = Abc_ObjRegular((Abc_Obj_t *)pObjAbc->pTemp)) && (pObjAig = Aig_Regular((Aig_Obj_t *)pObjAbc2->pTemp)) )
            pProbability[pObjAbc->Id] = pSwitching[pObjAig->Id];
    }
    Vec_IntFree( vSwitching );
    Aig_ManStop( pAig );
    Abc_NtkDelete( pNtkStr );
    return vProbs;
}